

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraALU_cpp.h
# Opt level: O0

u32 __thiscall moira::Moira::logic<(moira::Core)1,(moira::Instr)57,1>(Moira *this,u32 op1,u32 op2)

{
  bool bVar1;
  uint uVar2;
  u32 result;
  u32 op2_local;
  u32 op1_local;
  Moira *this_local;
  
  uVar2 = op1 ^ op2;
  bVar1 = NBIT<1>((ulong)uVar2);
  (this->reg).sr.n = bVar1;
  bVar1 = ZERO<1>((ulong)uVar2);
  (this->reg).sr.z = bVar1;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  return uVar2;
}

Assistant:

u32
Moira::logic(u32 op1, u32 op2)
{
    u32 result;

    switch (I) {

        case Instr::AND: case Instr::ANDI: case Instr::ANDICCR: case Instr::ANDISR: case Instr::AND_LOOP:

            result = op1 & op2;
            break;

        case Instr::OR: case Instr::ORI: case Instr::ORICCR: case Instr::ORISR: case Instr::OR_LOOP:

            result = op1 | op2;
            break;

        case Instr::EOR: case Instr::EORI: case Instr::EORICCR: case Instr::EORISR: case Instr::EOR_LOOP:

            result = op1 ^ op2;
            break;

        default:
            fatalError;
    }

    reg.sr.n = NBIT<S>(result);
    reg.sr.z = ZERO<S>(result);
    reg.sr.v = 0;
    reg.sr.c = 0;
    return result;
}